

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O0

void __thiscall
pybind11::detail::value_and_holder::value_and_holder(value_and_holder *this,size_t index)

{
  size_t index_local;
  value_and_holder *this_local;
  
  this->inst = (instance *)0x0;
  this->index = index;
  this->type = (type_info *)0x0;
  this->vh = (void **)0x0;
  return;
}

Assistant:

value_and_holder(size_t index) : index{index} {}